

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O3

u4 __thiscall ClassLoader::readU4(ClassLoader *this,FILE *fp)

{
  uint in_EAX;
  u4 uVar1;
  int iVar2;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if (this->isLittleEndian == true) {
    uVar1 = 0;
    iVar2 = 0x18;
    do {
      uStack_28._0_4_ = (uint)(uint3)uStack_28;
      fread((void *)((long)&uStack_28 + 3),1,1,(FILE *)fp);
      uVar1 = uVar1 + ((uint)uStack_28._3_1_ << ((byte)iVar2 & 0x1f));
      iVar2 = iVar2 + -8;
    } while (iVar2 != -8);
  }
  else {
    fread((void *)((long)&uStack_28 + 4),4,1,(FILE *)fp);
    uVar1 = uStack_28._4_4_;
  }
  return uVar1;
}

Assistant:

u4 ClassLoader::readU4(FILE *fp) {
    u4 result = 0;
    
    if (isLittleEndian) {
        for (int i = 0; i < 4; i++) {
            result += readU1(fp) << (24 - 8*i);
        }
    } else {
        fread(&result, sizeof(u4), 1, fp);
    }
    
    return result;
}